

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS VerifyJsonParsesAsNumberObjectSigned(_Bool IsJson5,char *Json,int64_t Number)

{
  WJTL_STATUS WVar1;
  JL_STATUS JVar2;
  JL_STATUS JVar3;
  WJTL_STATUS WVar4;
  JlDataObject *object;
  size_t errorAtPos;
  int64_t num64;
  JlDataObject *local_58;
  int64_t local_50;
  size_t local_48;
  size_t local_40;
  long local_38;
  
  local_58 = (JlDataObject *)0x0;
  local_40 = 100;
  WVar1 = JlParseJsonEx(Json,IsJson5,&local_58,&local_40);
  WVar4 = WVar1;
  if (WVar1 != WJTL_STATUS_SUCCESS) {
    WVar4 = WJTL_STATUS_FAILED;
  }
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsNumberObjectSigned",0xf9);
  if (local_58 != (JlDataObject *)0x0) {
    WjTestLib_Assert(true,"(object) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0xfc);
    local_48 = local_40;
    WjTestLib_Assert(local_40 == 0,"errorAtPos == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0xfd);
    local_50 = Number;
    JVar2 = JlGetObjectNumberS64(local_58,&local_38);
    WjTestLib_Assert(JVar2 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectNumberS64( object, &num64 ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0xff);
    WjTestLib_Assert(local_38 == Number,"Number == num64",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0x100);
    JVar3 = JlFreeObjectTree(&local_58);
    WjTestLib_Assert(JVar3 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &object ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0x102);
    if (local_58 != (JlDataObject *)0x0) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (JVar3 != JL_STATUS_SUCCESS) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (local_38 != local_50) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (JVar2 != JL_STATUS_SUCCESS) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    if (local_48 != 0) {
      WVar4 = WJTL_STATUS_FAILED;
    }
    WjTestLib_Assert(local_58 == (JlDataObject *)0x0,"(object) == NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectSigned",0x103);
  }
  return WVar4;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsNumberObjectSigned
    (
        bool            IsJson5,
        char const*     Json,
        int64_t         Number
    )
{
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    int64_t        num64;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ) );
    if( NULL != object )
    {
        JL_ASSERT_NOT_NULL( object );
        JL_ASSERT( errorAtPos == 0 );

        JL_ASSERT_SUCCESS( JlGetObjectNumberS64( object, &num64 ) );
        JL_ASSERT( Number == num64 );

        JL_ASSERT_SUCCESS( JlFreeObjectTree( &object ) );
        JL_ASSERT_NULL( object );
    }

    return TestReturn;
}